

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int aead_setup_crypto(ptls_aead_context_t *_ctx,int is_enc,void *key,void *iv,EVP_CIPHER *cipher)

{
  int iVar1;
  code *pcVar2;
  EVP_CIPHER_CTX *ctx;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  
  _ctx->dispose_crypto = aead_dispose_crypto;
  _ctx->do_get_iv = aead_get_iv;
  _ctx->do_set_iv = aead_set_iv;
  if (is_enc == 0) {
    pcVar2 = aead_do_decrypt;
    pcVar5 = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    pcVar7 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    pcVar6 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    pcVar4 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
              *)0x0;
    pcVar3 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_ptls_iovec_t_ptr_size_t_uint64_t_void_ptr_size_t
              *)0x0;
  }
  else {
    pcVar3 = ptls_aead__do_encrypt_v;
    pcVar4 = ptls_aead__do_encrypt;
    pcVar6 = aead_do_encrypt_final;
    pcVar7 = aead_do_encrypt_update;
    pcVar5 = aead_do_encrypt_init;
    pcVar2 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
              *)0x0;
  }
  _ctx->do_encrypt_init = pcVar5;
  _ctx->do_encrypt_update = pcVar7;
  _ctx->do_encrypt_final = pcVar6;
  _ctx->do_encrypt = pcVar4;
  _ctx->do_encrypt_v = pcVar3;
  _ctx->do_decrypt = pcVar2;
  _ctx[1].algo = (st_ptls_aead_algorithm_t *)0x0;
  ctx = EVP_CIPHER_CTX_new();
  _ctx[1].algo = (st_ptls_aead_algorithm_t *)ctx;
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    iVar1 = 0x201;
  }
  else {
    if (is_enc == 0) {
      iVar1 = EVP_DecryptInit_ex(ctx,(EVP_CIPHER *)cipher,(ENGINE *)0x0,(uchar *)key,(uchar *)0x0);
    }
    else {
      iVar1 = EVP_EncryptInit_ex(ctx,(EVP_CIPHER *)cipher,(ENGINE *)0x0,(uchar *)key,(uchar *)0x0);
    }
    if ((iVar1 != 0) &&
       (iVar1 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)_ctx[1].algo,9,(int)_ctx->algo->iv_size,
                                    (void *)0x0), iVar1 != 0)) {
      memcpy(&_ctx[1].dispose_crypto,iv,_ctx->algo->iv_size);
      return 0;
    }
    iVar1 = 0x203;
  }
  aead_dispose_crypto(_ctx);
  return iVar1;
}

Assistant:

static int aead_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key, const void *iv, const EVP_CIPHER *cipher)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    int ret;

    ctx->super.dispose_crypto = aead_dispose_crypto;
    ctx->super.do_get_iv = aead_get_iv;
    ctx->super.do_set_iv = aead_set_iv;
    if (is_enc) {
        ctx->super.do_encrypt_init = aead_do_encrypt_init;
        ctx->super.do_encrypt_update = aead_do_encrypt_update;
        ctx->super.do_encrypt_final = aead_do_encrypt_final;
        ctx->super.do_encrypt = ptls_aead__do_encrypt;
        ctx->super.do_encrypt_v = ptls_aead__do_encrypt_v;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_encrypt = NULL;
        ctx->super.do_encrypt_v = NULL;
        ctx->super.do_decrypt = aead_do_decrypt;
    }
    ctx->evp_ctx = NULL;

    if ((ctx->evp_ctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    if (is_enc) {
        if (!EVP_EncryptInit_ex(ctx->evp_ctx, cipher, NULL, key, NULL)) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
    } else {
        if (!EVP_DecryptInit_ex(ctx->evp_ctx, cipher, NULL, key, NULL)) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
    }
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_IVLEN, (int)ctx->super.algo->iv_size, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Error;
    }

    memcpy(ctx->static_iv, iv, ctx->super.algo->iv_size);

    return 0;

Error:
    aead_dispose_crypto(&ctx->super);
    return ret;
}